

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestExpectEvalsOnceInternal::Run(TestExpectEvalsOnceInternal *this)

{
  Outputter *pOVar1;
  bool bVar2;
  Capture<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>_> *pCVar3;
  Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>,_testinator::EQOp,_bool>_>
  *pCVar4;
  bool *pbVar5;
  int *piVar6;
  bool *tail;
  bool *tail_00;
  char (*s) [104];
  int *tail_01;
  char (*s_00) [104];
  stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>
  local_440;
  char *local_438;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
  local_430;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>_>
  local_400;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>_>
  local_3c8;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
  local_388;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
  local_340;
  testinator local_2f0 [32];
  stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>
  local_2d0;
  int local_2c8;
  undefined1 local_2c1 [9];
  Cons<std::pair<testinator::Nil,_const_char_*>_> *local_2b8;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>_> local_2b0;
  Cons<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>_> local_298
  ;
  undefined1 local_278 [8];
  Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
  diag_1;
  Capture<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_int_&>_> local_248;
  undefined1 local_238 [8];
  Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_int_&>,_testinator::EQOp,_int>_>
  cap_1;
  stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>
  local_209;
  char *local_208;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
  local_200;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>_>
  local_1d0;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>_>
  local_198;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
  local_158;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
  local_110;
  testinator local_c0 [39];
  stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>
  local_99;
  int local_98;
  undefined1 local_91 [9];
  Cons<std::pair<testinator::Nil,_const_char_*>_> *local_88;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>_> local_80;
  Cons<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>_> local_68;
  undefined1 local_48 [8];
  Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
  diag;
  Capture<testinator::Nothing> local_18;
  undefined1 local_17;
  undefined1 local_16 [4];
  undefined1 local_12;
  CountEvals local_11;
  Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>,_testinator::EQOp,_bool>_>
  cap;
  TestExpectEvalsOnceInternal *pTStack_10;
  CountEvals c;
  TestExpectEvalsOnceInternal *this_local;
  
  local_17 = 0;
  pTStack_10 = this;
  local_18 = (Capture<testinator::Nothing>)CountEvals::inc(&local_11);
  pCVar3 = testinator::operator->*
                     ((Capture<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>_>
                       *)&local_17,&local_18,tail);
  local_16._0_2_ = SUB82(pCVar3,0);
  diag.m_list._39_1_ = CountEvals::inc(&local_11);
  pCVar4 = testinator::operator==
                     ((Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>,_testinator::EQOp,_bool>_>
                       *)local_16,
                      (Capture<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>_>
                       *)&diag.m_list.field_0x27,tail_00);
  local_16._2_2_ = SUB82(pCVar4,0);
  local_12 = (undefined1)((ulong)pCVar4 >> 0x10);
  bVar2 = testinator::
          Eval<testinator::Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,testinator::SecondOp,bool>,testinator::EQOp,bool>>&>
                    ((Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>,_testinator::EQOp,_bool>_>
                      *)(local_16 + 2));
  if (!bVar2) {
    local_91[0] = 0;
    local_88 = testinator::operator<<
                         ((Cons<std::pair<testinator::Nil,_const_char_*>_> *)local_91,
                          (Cons<testinator::Nil> *)
                          "EXPECT FAILED: /workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:"
                          ,s);
    local_98 = 0xe8;
    testinator::operator<<
              (&local_80,(Cons<std::pair<testinator::Nil,_const_char_*>_> *)(local_91 + 1),&local_98
              );
    testinator::operator<<(&local_68,&local_80,(char (*) [25])" (c.inc() == c.inc() => ");
    pCVar4 = (Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>,_testinator::EQOp,_bool>_>
              *)(local_16 + 2);
    pbVar5 = testinator::
             LHS<testinator::Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,testinator::SecondOp,bool>,testinator::EQOp,bool>>&>
                       (pCVar4);
    local_99.m_t = (bool)testinator::prettyprint<bool>(pbVar5);
    testinator::operator<<
              ((Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
                *)local_48,&local_68,&local_99);
    pOVar1 = (this->super_Test).m_op;
    testinator::operator<<
              (&local_200,
               (Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
                *)local_48,(char (*) [2])0x274595);
    local_208 = testinator::
                RelOp<testinator::Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,testinator::SecondOp,bool>,testinator::EQOp,bool>>&>
                          (pCVar4);
    testinator::operator<<(&local_1d0,&local_200,&local_208);
    testinator::operator<<(&local_198,&local_1d0,(char (*) [2])0x274595);
    pbVar5 = testinator::
             RHS<testinator::Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,testinator::SecondOp,bool>,testinator::EQOp,bool>>&>
                       (pCVar4);
    local_209.m_t = (bool)testinator::prettyprint<bool>(pbVar5);
    testinator::operator<<(&local_158,&local_198,&local_209);
    testinator::operator<<(&local_110,&local_158,(char (*) [2])0x275bda);
    testinator::
    Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,int>,char_const*>,testinator::stringifier_select<bool,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>,char_const*>,char_const*>,testinator::stringifier_select<bool,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>>>
              (local_c0,&local_110);
    (*pOVar1->_vptr_Outputter[3])();
    std::__cxx11::string::~string((string *)local_c0);
    (this->super_Test).m_success = false;
  }
  memset((void *)((long)&diag_1.m_list.second.m_t + 7),0,1);
  local_248.m_list.m_pair.second =
       (int *)testinator::operator->*
                        ((Capture<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_int_&>_>
                          *)((long)&diag_1.m_list.second.m_t + 7),
                         (Capture<testinator::Nothing> *)&CountEvals::s_evals,tail_01);
  diag_1.m_list.second.m_t._0_4_ = 2;
  testinator::operator==
            ((Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_int_&>,_testinator::EQOp,_int>_>
              *)local_238,&local_248,(int *)&diag_1.m_list.second);
  bVar2 = testinator::
          Eval<testinator::Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,testinator::SecondOp,int&>,testinator::EQOp,int>>&>
                    ((Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_int_&>,_testinator::EQOp,_int>_>
                      *)local_238);
  if (!bVar2) {
    local_2c1[0] = 0;
    local_2b8 = testinator::operator<<
                          ((Cons<std::pair<testinator::Nil,_const_char_*>_> *)local_2c1,
                           (Cons<testinator::Nil> *)
                           "EXPECT FAILED: /workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:"
                           ,s_00);
    local_2c8 = 0xe9;
    testinator::operator<<
              (&local_2b0,(Cons<std::pair<testinator::Nil,_const_char_*>_> *)(local_2c1 + 1),
               &local_2c8);
    testinator::operator<<(&local_298,&local_2b0,(char (*) [31])" (CountEvals::s_evals == 2 => ");
    piVar6 = testinator::
             LHS<testinator::Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,testinator::SecondOp,int&>,testinator::EQOp,int>>&>
                       ((Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_int_&>,_testinator::EQOp,_int>_>
                         *)local_238);
    local_2d0.m_t = (int *)testinator::prettyprint<int&>(piVar6);
    testinator::operator<<
              ((Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
                *)local_278,&local_298,&local_2d0);
    pOVar1 = (this->super_Test).m_op;
    testinator::operator<<
              (&local_430,
               (Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
                *)local_278,(char (*) [2])0x274595);
    local_438 = testinator::
                RelOp<testinator::Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,testinator::SecondOp,int&>,testinator::EQOp,int>>&>
                          ((Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_int_&>,_testinator::EQOp,_int>_>
                            *)local_238);
    testinator::operator<<(&local_400,&local_430,&local_438);
    testinator::operator<<(&local_3c8,&local_400,(char (*) [2])0x274595);
    piVar6 = testinator::
             RHS<testinator::Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,testinator::SecondOp,int&>,testinator::EQOp,int>>&>
                       ((Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_int_&>,_testinator::EQOp,_int>_>
                         *)local_238);
    local_440.m_t = (int *)testinator::prettyprint<int>(piVar6);
    testinator::operator<<(&local_388,&local_3c8,&local_440);
    testinator::operator<<(&local_340,&local_388,(char (*) [2])0x275bda);
    testinator::
    Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,int>,char_const*>,testinator::stringifier_select<int,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>,char_const*>,char_const*>,testinator::stringifier_select<int,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>>>
              (local_2f0,&local_340);
    (*pOVar1->_vptr_Outputter[3])(pOVar1,local_2f0);
    std::__cxx11::string::~string((string *)local_2f0);
    (this->super_Test).m_success = false;
  }
  return true;
}

Assistant:

virtual bool Run()
  {
    CountEvals c;
    EXPECT(c.inc() == c.inc());
    EXPECT(CountEvals::s_evals == 2);
    return true;
  }